

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

void __thiscall soul::ValuePrinter::printFloat32(ValuePrinter *this,float value)

{
  uint uVar1;
  text *in_RSI;
  char *__str;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [16];
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  float local_14;
  ValuePrinter *pVStack_10;
  float value_local;
  ValuePrinter *this_local;
  
  local_14 = value;
  pVStack_10 = this;
  if ((value != 0.0) || (NAN(value))) {
    uVar1 = std::isnan((double)(ulong)(uint)value);
    if ((uVar1 & 1) == 0) {
      uVar1 = std::isinf((double)(ulong)(uint)local_14);
      if ((uVar1 & 1) == 0) {
        choc::text::floatToString_abi_cxx11_(&local_98,in_RSI,local_14);
        std::operator+(&local_78,&local_98,"f");
        local_58 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_78);
        (*this->_vptr_ValuePrinter[0x13])(this,local_58._0_8_,local_58._8_8_);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
      }
      else {
        __str = "_ninf32";
        if (0.0 < local_14) {
          __str = "_inf32";
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,__str);
        (*this->_vptr_ValuePrinter[0x13])(this,local_48._M_len,local_48._M_str);
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"_nan32");
      (*this->_vptr_ValuePrinter[0x13])(this,local_38._M_len,local_38._M_str);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"0");
    (*this->_vptr_ValuePrinter[0x13])(this,local_28._M_len,local_28._M_str);
  }
  return;
}

Assistant:

void ValuePrinter::printFloat32 (float value)
{
    if (value == 0)             return print ("0");
    if (std::isnan (value))     return print ("_nan32");
    if (std::isinf (value))     return print (value > 0 ? "_inf32" : "_ninf32");

    return print (choc::text::floatToString (value) + "f");
}